

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int subjRequiresPage(PgHdr *pPg)

{
  uint i;
  int iVar1;
  Pager *pPVar2;
  PagerSavepoint *pPVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  i = pPg->pgno;
  pPVar2 = pPg->pPager;
  iVar1 = pPVar2->nSavepoint;
  lVar5 = 0x18;
  lVar6 = 0;
  while( true ) {
    if (iVar1 <= lVar6) {
      return 0;
    }
    pPVar3 = pPVar2->aSavepoint;
    if ((i <= *(uint *)((long)pPVar3->aWalData + lVar5 + -0x20)) &&
       (iVar4 = sqlite3BitvecTest(*(Bitvec **)((long)pPVar3->aWalData + lVar5 + -0x28),i),
       iVar4 == 0)) break;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x30;
  }
  return 1;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pgno pgno = pPg->pgno;
  Pager *pPager = pPg->pPager;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    PagerSavepoint *p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTest(p->pInSavepoint, pgno) ){
      return 1;
    }
  }
  return 0;
}